

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeIdxRowid(sqlite3 *db,BtCursor *pCur,i64 *rowid)

{
  int iVar1;
  uint serial_type;
  uint uVar2;
  u32 typeRowid;
  u32 szHdr;
  Mem m;
  Mem v;
  uint local_a8;
  uint local_a4;
  Mem local_a0;
  MemValue local_68 [7];
  
  getCellInfo(pCur);
  local_a0.flags = 0;
  local_a0.szMalloc = 0;
  local_a0.db = db;
  iVar1 = sqlite3VdbeMemFromBtree(pCur,0,(pCur->info).nPayload,&local_a0);
  if (iVar1 == 0) {
    uVar2 = (int)*local_a0.z;
    if (*local_a0.z < '\0') {
      sqlite3GetVarint32((uchar *)local_a0.z,&local_a4);
      uVar2 = local_a4;
    }
    if ((2 < uVar2) && (uVar2 <= (uint)local_a0.n)) {
      serial_type = (int)local_a0.z[uVar2 - 1];
      if (local_a0.z[uVar2 - 1] < '\0') {
        sqlite3GetVarint32((uchar *)(local_a0.z + (uVar2 - 1)),&local_a8);
        serial_type = local_a8;
      }
      if ((serial_type != 7 && 0xfffffff6 < serial_type - 10) &&
         (uVar2 + ""[serial_type] <= (uint)local_a0.n)) {
        sqlite3VdbeSerialGet
                  ((uchar *)(local_a0.z + (local_a0.n - (uint)""[serial_type])),serial_type,
                   (Mem *)local_68);
        *rowid = (i64)local_68[0];
        if (((local_a0.flags & 0x2400) == 0) && (local_a0.szMalloc == 0)) {
          return 0;
        }
        vdbeMemClear(&local_a0);
        return 0;
      }
    }
    if (((local_a0.flags & 0x2400) != 0) || (local_a0.szMalloc != 0)) {
      vdbeMemClear(&local_a0);
    }
    iVar1 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13d23,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeIdxRowid(sqlite3 *db, BtCursor *pCur, i64 *rowid){
  i64 nCellKey = 0;
  int rc;
  u32 szHdr;        /* Size of the header */
  u32 typeRowid;    /* Serial type of the rowid */
  u32 lenRowid;     /* Size of the rowid */
  Mem m, v;

  /* Get the size of the index entry.  Only indices entries of less
  ** than 2GiB are support - anything large must be database corruption.
  ** Any corruption is detected in sqlite3BtreeParseCellPtr(), though, so
  ** this code can safely assume that nCellKey is 32-bits  
  */
  assert( sqlite3BtreeCursorIsValid(pCur) );
  nCellKey = sqlite3BtreePayloadSize(pCur);
  assert( (nCellKey & SQLITE_MAX_U32)==(u64)nCellKey );

  /* Read in the complete content of the index entry */
  sqlite3VdbeMemInit(&m, db, 0);
  rc = sqlite3VdbeMemFromBtree(pCur, 0, (u32)nCellKey, &m);
  if( rc ){
    return rc;
  }

  /* The index entry must begin with a header size */
  (void)getVarint32((u8*)m.z, szHdr);
  testcase( szHdr==3 );
  testcase( szHdr==m.n );
  testcase( szHdr>0x7fffffff );
  assert( m.n>=0 );
  if( unlikely(szHdr<3 || szHdr>(unsigned)m.n) ){
    goto idx_rowid_corruption;
  }

  /* The last field of the index should be an integer - the ROWID.
  ** Verify that the last entry really is an integer. */
  (void)getVarint32((u8*)&m.z[szHdr-1], typeRowid);
  testcase( typeRowid==1 );
  testcase( typeRowid==2 );
  testcase( typeRowid==3 );
  testcase( typeRowid==4 );
  testcase( typeRowid==5 );
  testcase( typeRowid==6 );
  testcase( typeRowid==8 );
  testcase( typeRowid==9 );
  if( unlikely(typeRowid<1 || typeRowid>9 || typeRowid==7) ){
    goto idx_rowid_corruption;
  }
  lenRowid = sqlite3SmallTypeSizes[typeRowid];
  testcase( (u32)m.n==szHdr+lenRowid );
  if( unlikely((u32)m.n<szHdr+lenRowid) ){
    goto idx_rowid_corruption;
  }

  /* Fetch the integer off the end of the index record */
  sqlite3VdbeSerialGet((u8*)&m.z[m.n-lenRowid], typeRowid, &v);
  *rowid = v.u.i;
  sqlite3VdbeMemRelease(&m);
  return SQLITE_OK;

  /* Jump here if database corruption is detected after m has been
  ** allocated.  Free the m object and return SQLITE_CORRUPT. */
idx_rowid_corruption:
  testcase( m.szMalloc!=0 );
  sqlite3VdbeMemRelease(&m);
  return SQLITE_CORRUPT_BKPT;
}